

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O1

void DES_ede3_cbc_encrypt_ex
               (uint8_t *in,uint8_t *out,size_t len,DES_key_schedule *ks1,DES_key_schedule *ks2,
               DES_key_schedule *ks3,uint8_t *ivec,int enc)

{
  byte *pbVar1;
  DES_key_schedule *ks2_00;
  DES_key_schedule *pDVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint32_t tin [2];
  uint local_58;
  uint local_54;
  DES_key_schedule *local_50;
  DES_key_schedule *local_48;
  uint local_3c;
  DES_key_schedule *local_38;
  
  uVar3 = *(uint *)ivec;
  uVar5 = *(uint *)(ivec + 4);
  local_50 = (DES_key_schedule *)ks1;
  local_48 = (DES_key_schedule *)ks2;
  if (enc == 0) {
    uVar6 = uVar3;
    uVar4 = uVar5;
    pDVar2 = (DES_key_schedule *)ks3;
    if (7 < len) {
      do {
        local_38 = pDVar2;
        uVar3 = *(uint *)in;
        uVar5 = *(uint *)((long)in + 4);
        in = (uint8_t *)((long)in + 8);
        local_58 = uVar3;
        local_54 = uVar5;
        local_3c = uVar4;
        DES_decrypt3(&local_58,local_50,local_48,local_38);
        uVar6 = uVar6 ^ local_58;
        local_54 = local_3c ^ local_54;
        *out = (uint8_t)uVar6;
        out[1] = (uint8_t)(uVar6 >> 8);
        out[2] = (uint8_t)(uVar6 >> 0x10);
        out[3] = (uint8_t)(uVar6 >> 0x18);
        out[4] = (uint8_t)local_54;
        out[5] = (uint8_t)(local_54 >> 8);
        out[6] = (uint8_t)(local_54 >> 0x10);
        out[7] = (uint8_t)(local_54 >> 0x18);
        out = out + 8;
        len = len - 8;
        ks3 = (DES_key_schedule *)local_38;
        uVar6 = uVar3;
        uVar4 = uVar5;
        pDVar2 = local_38;
      } while (7 < len);
    }
    ks2_00 = local_48;
    pDVar2 = local_50;
    local_58 = uVar3;
    local_54 = uVar5;
    if (len != 0) {
      local_58 = *(uint *)in;
      local_54 = *(uint *)((long)in + 4);
      local_48 = (DES_key_schedule *)CONCAT44(local_48._4_4_,local_58);
      local_50 = (DES_key_schedule *)CONCAT44(local_50._4_4_,local_54);
      DES_decrypt3(&local_58,pDVar2,ks2_00,(DES_key_schedule *)ks3);
      (*(code *)(&DAT_003b1864 + *(int *)(&DAT_003b1864 + (len - 1) * 4)))();
      return;
    }
    goto LAB_0031ab7d;
  }
  local_58 = uVar3;
  local_54 = uVar5;
  if (7 < len) {
    do {
      local_58 = uVar3 ^ *(uint *)in;
      local_54 = uVar5 ^ *(uint *)((long)in + 4);
      in = (uint8_t *)((long)in + 8);
      DES_encrypt3(&local_58,local_50,local_48,(DES_key_schedule *)ks3);
      *out = (uint8_t)local_58;
      out[1] = (uint8_t)(local_58 >> 8);
      out[2] = (uint8_t)(local_58 >> 0x10);
      out[3] = (uint8_t)(local_58 >> 0x18);
      out[4] = (uint8_t)local_54;
      out[5] = (uint8_t)(local_54 >> 8);
      out[6] = (uint8_t)(local_54 >> 0x10);
      out[7] = (uint8_t)(local_54 >> 0x18);
      out = out + 8;
      len = len - 8;
      uVar3 = local_58;
      uVar5 = local_54;
    } while (7 < len);
  }
  if (len == 0) goto LAB_0031ab7d;
  lVar7 = (long)in + len;
  uVar3 = 0;
  switch(len) {
  case 1:
    uVar6 = 0;
    goto LAB_0031aac5;
  case 2:
    uVar6 = 0;
    goto LAB_0031aab8;
  case 3:
    uVar6 = 0;
    uVar5 = uVar3;
    break;
  case 7:
    pbVar1 = (byte *)(lVar7 + -1);
    lVar7 = lVar7 + -1;
    uVar3 = (uint)*pbVar1 << 0x10;
  case 6:
    pbVar1 = (byte *)(lVar7 + -1);
    lVar7 = lVar7 + -1;
    uVar3 = uVar3 | (uint)*pbVar1 << 8;
  case 5:
    pbVar1 = (byte *)(lVar7 + -1);
    lVar7 = lVar7 + -1;
    uVar3 = uVar3 | *pbVar1;
  case 4:
    pbVar1 = (byte *)(lVar7 + -1);
    lVar7 = lVar7 + -1;
    uVar5 = (uint)*pbVar1 << 0x18;
    uVar6 = uVar3;
  }
  pbVar1 = (byte *)(lVar7 + -1);
  lVar7 = lVar7 + -1;
  uVar3 = uVar5 | (uint)*pbVar1 << 0x10;
LAB_0031aab8:
  pbVar1 = (byte *)(lVar7 + -1);
  lVar7 = lVar7 + -1;
  uVar3 = uVar3 | (uint)*pbVar1 << 8;
LAB_0031aac5:
  local_58 = (*(byte *)(lVar7 + -1) | uVar3) ^ local_58;
  local_54 = uVar6 ^ local_54;
  DES_encrypt3(&local_58,local_50,local_48,(DES_key_schedule *)ks3);
  *out = (uint8_t)local_58;
  out[1] = (uint8_t)(local_58 >> 8);
  out[2] = (uint8_t)(local_58 >> 0x10);
  out[3] = (uint8_t)(local_58 >> 0x18);
  out[4] = (uint8_t)local_54;
  out[5] = (uint8_t)(local_54 >> 8);
  out[6] = (uint8_t)(local_54 >> 0x10);
  out[7] = (uint8_t)(local_54 >> 0x18);
LAB_0031ab7d:
  *ivec = (uint8_t)local_58;
  ivec[1] = (uint8_t)(local_58 >> 8);
  ivec[2] = (uint8_t)(local_58 >> 0x10);
  ivec[3] = (uint8_t)(local_58 >> 0x18);
  ivec[4] = (uint8_t)local_54;
  ivec[5] = (uint8_t)(local_54 >> 8);
  ivec[6] = (uint8_t)(local_54 >> 0x10);
  ivec[7] = (uint8_t)(local_54 >> 0x18);
  return;
}

Assistant:

void DES_ede3_cbc_encrypt_ex(const uint8_t *in, uint8_t *out, size_t len,
                             const DES_key_schedule *ks1,
                             const DES_key_schedule *ks2,
                             const DES_key_schedule *ks3, uint8_t ivec[8],
                             int enc) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  uint32_t tin[2];
  uint8_t *iv;

  iv = ivec;

  if (enc) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin1 ^= tout1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_encrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      l2c(tout0, out);
      l2c(tout1, out);
    }
    if (len != 0) {
      c2ln(in, tin0, tin1, len);
      tin0 ^= tout0;
      tin1 ^= tout1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_encrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      l2c(tout0, out);
      l2c(tout1, out);
    }
    iv = ivec;
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    uint32_t t0, t1;

    c2l(iv, xor0);
    c2l(iv, xor1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);

      t0 = tin0;
      t1 = tin1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_decrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      tout0 ^= xor0;
      tout1 ^= xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = t0;
      xor1 = t1;
    }
    if (len != 0) {
      c2l(in, tin0);
      c2l(in, tin1);

      t0 = tin0;
      t1 = tin1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_decrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      tout0 ^= xor0;
      tout1 ^= xor1;
      l2cn(tout0, tout1, out, len);
      xor0 = t0;
      xor1 = t1;
    }

    iv = ivec;
    l2c(xor0, iv);
    l2c(xor1, iv);
  }

  tin[0] = tin[1] = 0;
}